

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c_portable.cc
# Opt level: O0

uint32_t crc32c::ExtendPortable(uint32_t crc,uint8_t *data,size_t size)

{
  long lVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  byte *pbVar8;
  long in_RDX;
  byte *in_RSI;
  uint in_EDI;
  long in_FS_OFFSET;
  int c_1;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  uint32_t tmp;
  uint32_t crc3;
  uint32_t crc2;
  uint32_t crc1;
  uint32_t crc0;
  int c;
  uint8_t *x;
  uint32_t l;
  uint8_t *e;
  uint8_t *p;
  uint8_t *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_34;
  byte *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar7 = in_RSI + in_RDX;
  local_34 = in_EDI ^ 0xffffffff;
  pbVar8 = RoundUp<4>(in_stack_ffffffffffffff78);
  local_28 = in_RSI;
  if (pbVar8 <= pbVar7) {
    for (; local_28 != pbVar8; local_28 = local_28 + 1) {
      local_34 = *(uint *)(::(anonymous_namespace)::kByteExtensionTable +
                          (long)(int)(local_34 & 0xff ^ (uint)*local_28) * 4) ^ local_34 >> 8;
    }
  }
  if (0xf < (long)pbVar7 - (long)local_28) {
    uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    local_48 = uVar2 ^ local_34;
    local_4c = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                           );
    local_50 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                           );
    local_54 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                           );
    for (local_28 = local_28 + 0x10; 0x100 < (long)pbVar7 - (long)local_28;
        local_28 = local_28 + 0x40) {
      RequestPrefetch(in_stack_ffffffffffffff78);
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      uVar3 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                               (ulong)(local_48 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(local_48 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                       (ulong)(local_48 >> 0x10 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                       (ulong)(local_48 >> 0x18) * 4);
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      uVar4 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                               (ulong)(local_4c & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(local_4c >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                       (ulong)(local_4c >> 0x10 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                       (ulong)(local_4c >> 0x18) * 4);
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      uVar5 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                               (ulong)(local_50 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(local_50 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                       (ulong)(local_50 >> 0x10 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                       (ulong)(local_50 >> 0x18) * 4);
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      uVar6 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                               (ulong)(local_54 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(local_54 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                       (ulong)(local_54 >> 0x10 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                       (ulong)(local_54 >> 0x18) * 4);
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      uVar3 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                               (ulong)(uVar3 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar3 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                       (ulong)(uVar3 >> 0x10 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar3 >> 0x18) * 4
                       );
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      uVar4 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                               (ulong)(uVar4 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar4 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                       (ulong)(uVar4 >> 0x10 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar4 >> 0x18) * 4
                       );
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      uVar5 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                               (ulong)(uVar5 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                       (ulong)(uVar5 >> 0x10 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar5 >> 0x18) * 4
                       );
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      uVar6 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                               (ulong)(uVar6 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar6 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                       (ulong)(uVar6 >> 0x10 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar6 >> 0x18) * 4
                       );
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      uVar3 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                               (ulong)(uVar3 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar3 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                       (ulong)(uVar3 >> 0x10 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar3 >> 0x18) * 4
                       );
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      uVar4 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                               (ulong)(uVar4 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar4 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                       (ulong)(uVar4 >> 0x10 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar4 >> 0x18) * 4
                       );
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      uVar5 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                               (ulong)(uVar5 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                       (ulong)(uVar5 >> 0x10 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar5 >> 0x18) * 4
                       );
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      uVar6 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                               (ulong)(uVar6 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar6 >> 8 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                       (ulong)(uVar6 >> 0x10 & 0xff) * 4) ^
              *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar6 >> 0x18) * 4
                       );
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      local_48 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                                  (ulong)(uVar3 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar3 >> 8 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                          (ulong)(uVar3 >> 0x10 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar3 >> 0x18) * 4);
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      local_4c = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                                  (ulong)(uVar4 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar4 >> 8 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                          (ulong)(uVar4 >> 0x10 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar4 >> 0x18) * 4);
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      local_50 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                                  (ulong)(uVar5 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar5 >> 8 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                          (ulong)(uVar5 >> 0x10 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar5 >> 0x18) * 4);
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      local_54 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                                  (ulong)(uVar6 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar6 >> 8 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                          (ulong)(uVar6 >> 0x10 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(uVar6 >> 0x18) * 4);
    }
    for (; 0xf < (long)pbVar7 - (long)local_28; local_28 = local_28 + 0x10) {
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      local_48 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                                  (ulong)(local_48 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(local_48 >> 8 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                          (ulong)(local_48 >> 0x10 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(local_48 >> 0x18) * 4);
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      local_4c = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                                  (ulong)(local_4c & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(local_4c >> 8 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                          (ulong)(local_4c >> 0x10 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(local_4c >> 0x18) * 4);
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      local_50 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                                  (ulong)(local_50 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(local_50 >> 8 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                          (ulong)(local_50 >> 0x10 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(local_50 >> 0x18) * 4);
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      local_54 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                                  (ulong)(local_54 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(local_54 >> 8 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                          (ulong)(local_54 >> 0x10 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 +
                          (ulong)(local_54 >> 0x18) * 4);
    }
    for (; 3 < (long)pbVar7 - (long)local_28; local_28 = local_28 + 4) {
      uVar2 = ReadUint32LE((uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
      ;
      uVar3 = local_48 & 0xff;
      uVar4 = local_48 >> 8;
      uVar5 = local_48 >> 0x10;
      uVar6 = local_48 >> 0x18;
      local_48 = local_4c;
      local_4c = local_50;
      local_50 = local_54;
      local_54 = uVar2 ^ *(uint *)(::(anonymous_namespace)::kStrideExtensionTable3 +
                                  (ulong)uVar3 * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar4 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable1 +
                          (ulong)(uVar5 & 0xff) * 4) ^
                 *(uint *)(::(anonymous_namespace)::kStrideExtensionTable0 + (ulong)uVar6 * 4);
    }
    for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
      local_48 = local_48 >> 8 ^
                 *(uint *)(::(anonymous_namespace)::kByteExtensionTable +
                          (ulong)(local_48 & 0xff) * 4);
    }
    local_4c = local_48 ^ local_4c;
    for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
      local_4c = local_4c >> 8 ^
                 *(uint *)(::(anonymous_namespace)::kByteExtensionTable +
                          (ulong)(local_4c & 0xff) * 4);
    }
    local_50 = local_4c ^ local_50;
    for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
      local_50 = local_50 >> 8 ^
                 *(uint *)(::(anonymous_namespace)::kByteExtensionTable +
                          (ulong)(local_50 & 0xff) * 4);
    }
    local_54 = local_50 ^ local_54;
    for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
      local_54 = local_54 >> 8 ^
                 *(uint *)(::(anonymous_namespace)::kByteExtensionTable +
                          (ulong)(local_54 & 0xff) * 4);
    }
    local_34 = local_54;
  }
  for (; local_28 != pbVar7; local_28 = local_28 + 1) {
    local_34 = *(uint *)(::(anonymous_namespace)::kByteExtensionTable +
                        (long)(int)(local_34 & 0xff ^ (uint)*local_28) * 4) ^ local_34 >> 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return ~local_34;
}

Assistant:

uint32_t ExtendPortable(uint32_t crc, const uint8_t* data, size_t size) {
  const uint8_t* p = data;
  const uint8_t* e = p + size;
  uint32_t l = crc ^ kCRC32Xor;

// Process one byte at a time.
#define STEP1                              \
  do {                                     \
    int c = (l & 0xff) ^ *p++;             \
    l = kByteExtensionTable[c] ^ (l >> 8); \
  } while (0)

// Process one of the 4 strides of 4-byte data.
#define STEP4(s)                                                               \
  do {                                                                         \
    crc##s = ReadUint32LE(p + s * 4) ^ kStrideExtensionTable3[crc##s & 0xff] ^ \
             kStrideExtensionTable2[(crc##s >> 8) & 0xff] ^                    \
             kStrideExtensionTable1[(crc##s >> 16) & 0xff] ^                   \
             kStrideExtensionTable0[crc##s >> 24];                             \
  } while (0)

// Process a 16-byte swath of 4 strides, each of which has 4 bytes of data.
#define STEP16 \
  do {         \
    STEP4(0);  \
    STEP4(1);  \
    STEP4(2);  \
    STEP4(3);  \
    p += 16;   \
  } while (0)

// Process 4 bytes that were already loaded into a word.
#define STEP4W(w)                                   \
  do {                                              \
    w ^= l;                                         \
    for (size_t i = 0; i < 4; ++i) {                \
      w = (w >> 8) ^ kByteExtensionTable[w & 0xff]; \
    }                                               \
    l = w;                                          \
  } while (0)

  // Point x at first 4-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<4>(p);
  if (x <= e) {
    // Process bytes p is 4-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  if ((e - p) >= 16) {
    // Load a 16-byte swath into the stride partial results.
    uint32_t crc0 = ReadUint32LE(p + 0 * 4) ^ l;
    uint32_t crc1 = ReadUint32LE(p + 1 * 4);
    uint32_t crc2 = ReadUint32LE(p + 2 * 4);
    uint32_t crc3 = ReadUint32LE(p + 3 * 4);
    p += 16;

    while ((e - p) > kPrefetchHorizon) {
      RequestPrefetch(p + kPrefetchHorizon);

      // Process 64 bytes at a time.
      STEP16;
      STEP16;
      STEP16;
      STEP16;
    }

    // Process one 16-byte swath at a time.
    while ((e - p) >= 16) {
      STEP16;
    }

    // Advance one word at a time as far as possible.
    while ((e - p) >= 4) {
      STEP4(0);
      uint32_t tmp = crc0;
      crc0 = crc1;
      crc1 = crc2;
      crc2 = crc3;
      crc3 = tmp;
      p += 4;
    }

    // Combine the 4 partial stride results.
    l = 0;
    STEP4W(crc0);
    STEP4W(crc1);
    STEP4W(crc2);
    STEP4W(crc3);
  }

  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef STEP4W
#undef STEP16
#undef STEP4
#undef STEP1
  return l ^ kCRC32Xor;
}